

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O1

int websocket_write(ws_s *ws,fio_str_info_s msg,uint8_t is_text)

{
  int iVar1;
  
  iVar1 = fio_is_valid(ws->fd);
  if (iVar1 == 0) {
    iVar1 = -1;
  }
  else {
    websocket_write_impl(ws->fd,msg.data,msg.len,is_text,'\x01','\x01',ws->is_client);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int websocket_write(ws_s *ws, fio_str_info_s msg, uint8_t is_text) {
  if (fio_is_valid(ws->fd)) {
    websocket_write_impl(ws->fd, msg.data, msg.len, is_text, 1, 1,
                         ws->is_client);
    return 0;
  }
  return -1;
}